

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall kj::_::EagerPromiseNode<kj::_::Void>::destroy(EagerPromiseNode<kj::_::Void> *this)

{
  PromiseArenaMember *node;
  
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  (this->super_EagerPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_006200f0;
  (this->super_EagerPromiseNodeBase).super_Event._vptr_Event = (_func_int **)&DAT_00620138;
  node = &((this->super_EagerPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_EagerPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  Event::~Event(&(this->super_EagerPromiseNodeBase).super_Event);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }